

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O1

natwm_state * natwm_state_create(void)

{
  int iVar1;
  natwm_state *pnVar2;
  natwm_state *pnVar3;
  
  pnVar2 = (natwm_state *)calloc(1,0x70);
  if (pnVar2 == (natwm_state *)0x0) {
    pnVar3 = (natwm_state *)0x0;
  }
  else {
    pnVar2->screen_num = -1;
    pnVar2->xcb = (xcb_connection_t *)0x0;
    pnVar2->ewmh = (xcb_ewmh_connection_t *)0x0;
    pnVar2->screen = (xcb_screen_t *)0x0;
    pnVar2->button_state = (button_state *)0x0;
    pnVar2->monitor_list = (monitor_list *)0x0;
    pnVar2->workspace_list = (workspace_list *)0x0;
    pnVar2->config = (map *)0x0;
    pnVar2->config_path = (char *)0x0;
    iVar1 = pthread_mutex_init((pthread_mutex_t *)&pnVar2->mutex,(pthread_mutexattr_t *)0x0);
    pnVar3 = (natwm_state *)0x0;
    if (iVar1 == 0) {
      pnVar3 = pnVar2;
    }
  }
  return pnVar3;
}

Assistant:

struct natwm_state *natwm_state_create(void)
{
        struct natwm_state *state = calloc(1, sizeof(struct natwm_state));

        if (state == NULL) {
                return NULL;
        }

        state->screen_num = -1;
        state->xcb = NULL;
        state->ewmh = NULL;
        state->screen = NULL;
        state->button_state = NULL;
        state->monitor_list = NULL;
        state->workspace_list = NULL;
        state->config = NULL;
        state->config_path = NULL;

        // Initialize mutex
        if (pthread_mutex_init(&state->mutex, NULL) != 0) {
                return NULL;
        }

        return state;
}